

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O1

uint64_t capnp::compiler::generateGroupId(uint64_t parentId,uint16_t groupIndex)

{
  uchar *puVar1;
  long lVar2;
  ulong uVar3;
  uint i;
  undefined2 *puVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  byte bytes [10];
  TypeIdGenerator generator;
  uchar local_b0 [8];
  undefined2 local_a8 [2];
  TypeIdGenerator local_a4;
  
  puVar1 = local_b0;
  local_a8[0] = 0;
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  lVar2 = 0;
  do {
    *puVar1 = (uchar)(parentId >> ((byte)lVar2 & 0x3f));
    puVar1 = puVar1 + 1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x40);
  puVar4 = local_a8;
  lVar2 = 0;
  do {
    *(char *)puVar4 = (char)(groupIndex >> ((byte)lVar2 & 0x1f));
    lVar2 = lVar2 + 8;
    puVar4 = (undefined2 *)((long)puVar4 + 1);
  } while (lVar2 == 8);
  local_a4.finished = false;
  local_a4.ctx.a = 0x67452301;
  local_a4.ctx.b = 0xefcdab89;
  local_a4.ctx.c = 0x98badcfe;
  local_a4.ctx.d = 0x10325476;
  local_a4.ctx.lo = 0;
  local_a4.ctx.hi = 0;
  AVar5.size_ = 10;
  AVar5.ptr = local_b0;
  TypeIdGenerator::update(&local_a4,AVar5);
  AVar5 = TypeIdGenerator::finish(&local_a4);
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = (ulong)AVar5.ptr[lVar2] | uVar3 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return uVar3 | 0x8000000000000000;
}

Assistant:

uint64_t generateGroupId(uint64_t parentId, uint16_t groupIndex) {
  // Compute ID by hashing the concatenation of the parent ID and the group index, and
  // then taking the first 8 bytes.

  kj::byte bytes[sizeof(uint64_t) + sizeof(uint16_t)]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    bytes[i] = (parentId >> (i * 8)) & 0xff;
  }
  for (uint i = 0; i < sizeof(uint16_t); i++) {
    bytes[sizeof(uint64_t) + i] = (groupIndex >> (i * 8)) & 0xff;
  }

  TypeIdGenerator generator;
  generator.update(bytes);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}